

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O0

object_ptr __thiscall mjs::make_regexp(mjs *this,gc_heap_ptr<mjs::global_object> *global,regexp *re)

{
  regexp_flag flags;
  undefined8 extraout_RDX;
  object_ptr oVar1;
  wstring_view local_40;
  undefined1 local_30 [24];
  regexp *re_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  local_30._16_8_ = re;
  re_local = (regexp *)global;
  global_local = (gc_heap_ptr<mjs::global_object> *)this;
  local_40 = regexp::pattern(re);
  flags = regexp::flags((regexp *)local_30._16_8_);
  regexp_object::make((regexp_object *)local_30,global,&local_40,flags);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::regexp_object,void>
            ((gc_heap_ptr<mjs::object> *)this,(gc_heap_ptr<mjs::regexp_object> *)local_30);
  gc_heap_ptr<mjs::regexp_object>::~gc_heap_ptr((gc_heap_ptr<mjs::regexp_object> *)local_30);
  oVar1.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar1.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar1.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr make_regexp(const gc_heap_ptr<global_object>& global, const regexp& re) {
    return regexp_object::make(global, re.pattern(), re.flags());
}